

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O3

int socket_buffer_size(int socket_fd,Direction direction)

{
  undefined4 in_EAX;
  int iVar1;
  int buffer_size;
  socklen_t value_size;
  int local_8;
  socklen_t sStack_4;
  
  _local_8 = CONCAT44(4,in_EAX);
  iVar1 = getsockopt(socket_fd,1,8 - (uint)(direction == SEND),&local_8,&sStack_4);
  if (iVar1 != -1) {
    return local_8;
  }
  throw("Error getting buffer size");
}

Assistant:

int socket_buffer_size(int socket_fd, Direction direction) {
	int return_code;
	int buffer_size;
	socklen_t value_size = sizeof buffer_size;

	// clang-format off
	return_code = getsockopt(
		socket_fd,
		SOL_SOCKET,
		(direction == SEND) ? SO_SNDBUF : SO_RCVBUF,
		&buffer_size,
		&value_size
	);
	// clang-format on

	if (return_code == -1) {
		throw("Error getting buffer size");
	}

	return buffer_size;
}